

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O1

void deqp::egl::initSurface(Functions *gl,IVec2 *oldSize)

{
  int i_1;
  int i;
  long lVar1;
  Vector<int,_2> res_1;
  Vector<int,_2> res;
  int local_e0 [2];
  IVec2 local_d8;
  IVec2 local_d0;
  IVec2 local_c8;
  IVec2 local_c0;
  IVec2 local_b8;
  IVec2 local_b0;
  IVec2 local_a8;
  IVec2 local_a0;
  IVec2 local_98;
  IVec2 local_90;
  IVec2 local_88;
  IVec2 local_80;
  Vec3 local_78;
  Vec3 local_6c;
  Vec3 local_60;
  Vec3 local_54;
  Vec3 local_48;
  Vec3 local_3c;
  
  lVar1 = 0;
  local_80.m_data[0] = 0;
  local_80.m_data[1] = 0;
  local_c0 = *(IVec2 *)oldSize->m_data;
  local_3c.m_data[0] = 0.0;
  local_3c.m_data[1] = 0.0;
  local_3c.m_data[2] = 1.0;
  drawRectangle(gl,&local_80,&local_c0,&local_3c);
  local_c8.m_data[0] = 2;
  local_c8.m_data[1] = 2;
  local_e0[0] = 4;
  local_e0[1] = 4;
  local_d0.m_data[0] = 0;
  local_d0.m_data[1] = 0;
  do {
    local_d0.m_data[lVar1] = oldSize->m_data[lVar1] - local_e0[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  local_48.m_data[0] = 1.0;
  local_48.m_data[1] = 0.0;
  lVar1 = 0;
  local_48.m_data[2] = 0.0;
  drawRectangle(gl,&local_c8,&local_d0,&local_48);
  local_88.m_data[0] = 0;
  local_88.m_data[1] = 0;
  local_90.m_data[0] = 8;
  local_90.m_data[1] = 4;
  local_54.m_data[0] = 0.0;
  local_54.m_data[1] = 1.0;
  local_54.m_data[2] = 0.0;
  drawRectangle(gl,&local_88,&local_90,&local_54);
  local_e0[0] = 0x10;
  local_e0[1] = 0x10;
  local_d8.m_data[0] = 0;
  local_d8.m_data[1] = 0;
  do {
    local_d8.m_data[lVar1] = oldSize->m_data[lVar1] - local_e0[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  local_98.m_data[0] = 8;
  local_98.m_data[1] = 4;
  local_60.m_data[0] = 0.0;
  local_60.m_data[1] = 1.0;
  local_60.m_data[2] = 0.0;
  drawRectangle(gl,&local_d8,&local_98,&local_60);
  local_a0.m_data[1] = oldSize->m_data[1] + -0x10;
  local_a0.m_data[0] = 0;
  local_a8.m_data[0] = 8;
  local_a8.m_data[1] = 4;
  local_6c.m_data[0] = 0.0;
  local_6c.m_data[1] = 1.0;
  local_6c.m_data[2] = 0.0;
  drawRectangle(gl,&local_a0,&local_a8,&local_6c);
  local_b0.m_data[0] = oldSize->m_data[0] + -0x10;
  local_b0.m_data[1] = 0;
  local_b8.m_data[0] = 8;
  local_b8.m_data[1] = 4;
  local_78.m_data[0] = 0.0;
  local_78.m_data[1] = 1.0;
  local_78.m_data[2] = 0.0;
  drawRectangle(gl,&local_b0,&local_b8,&local_78);
  return;
}

Assistant:

void initSurface (const glw::Functions& gl, IVec2 oldSize)
{
	const Vec3	frameColor	(0.0f, 0.0f, 1.0f);
	const Vec3	fillColor	(1.0f, 0.0f, 0.0f);
	const Vec3	markColor	(0.0f, 1.0f, 0.0f);

	drawRectangle(gl, IVec2(0, 0), oldSize, frameColor);
	drawRectangle(gl, IVec2(2, 2), oldSize - IVec2(4, 4), fillColor);

	drawRectangle(gl, IVec2(0, 0), IVec2(8, 4), markColor);
	drawRectangle(gl, oldSize - IVec2(16, 16), IVec2(8, 4), markColor);
	drawRectangle(gl, IVec2(0, oldSize.y() - 16), IVec2(8, 4), markColor);
	drawRectangle(gl, IVec2(oldSize.x() - 16, 0), IVec2(8, 4), markColor);
}